

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_sock.c
# Opt level: O1

_Bool uo_sock_init(void)

{
  if (is_init == '\0') {
    is_init = '\x01';
  }
  return true;
}

Assistant:

bool uo_sock_init()
{
    if (is_init)
        return true;

    is_init = true;

    #ifdef UO_SOCK_WIN32

        is_init &= WSAStartup(MAKEWORD(1, 1), &WsaDat) == 0;

    #endif

    atexit(uo_sock_quit);
    return is_init;
}